

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall SimpleString::replace(SimpleString *this,char *to,char *with)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t n;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  SimpleString local_40;
  
  SimpleString(&local_40,to);
  sVar3 = count(this,&local_40);
  ~SimpleString(&local_40);
  if (sVar3 != 0) {
    sVar4 = size(this);
    n = StrLen(to);
    sVar5 = StrLen(with);
    lVar8 = (sVar5 - n) * sVar3;
    sVar3 = lVar8 + sVar4 + 1;
    if (sVar3 < 2) {
      setInternalBufferAsEmptyString(this);
      return;
    }
    pcVar6 = allocStringBuffer(sVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O2/_deps/cpputest-src/src/CppUTest/SimpleString.cpp"
                               ,0x197);
    lVar10 = 0;
    for (uVar11 = 0; uVar11 < sVar4; uVar11 = uVar11 + sVar7) {
      pcVar1 = this->buffer_;
      iVar2 = StrNCmp(pcVar1 + uVar11,to,n);
      if (iVar2 == 0) {
        StrNCpy(pcVar6 + lVar10,with,sVar5 + 1);
        sVar7 = n;
        sVar9 = sVar5;
      }
      else {
        pcVar6[lVar10] = pcVar1[uVar11];
        sVar7 = 1;
        sVar9 = 1;
      }
      lVar10 = lVar10 + sVar9;
    }
    pcVar6[lVar8 + sVar4] = '\0';
    deallocateInternalBuffer(this);
    this->bufferSize_ = sVar3;
    this->buffer_ = pcVar6;
  }
  return;
}

Assistant:

void SimpleString::replace(const char* to, const char* with)
{
    size_t c = count(to);
    if (c == 0) {
        return;
    }
    size_t len = size();
    size_t tolen = StrLen(to);
    size_t withlen = StrLen(with);

    size_t newsize = len + (withlen * c) - (tolen * c) + 1;

    if (newsize > 1) {
        char* newbuf = allocStringBuffer(newsize, __FILE__, __LINE__);
        for (size_t i = 0, j = 0; i < len;) {
            if (StrNCmp(&getBuffer()[i], to, tolen) == 0) {
                StrNCpy(&newbuf[j], with, withlen + 1);
                j += withlen;
                i += tolen;
            }
            else {
                newbuf[j] = getBuffer()[i];
                j++;
                i++;
            }
        }
        newbuf[newsize - 1] = '\0';
        setInternalBufferTo(newbuf, newsize);
    }
    else
        setInternalBufferAsEmptyString();
}